

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_lin_fuzzer.cc
# Opt level: O0

void __thiscall FuzzHelper::doWrite(FuzzHelper *this,shared_ptr<QPDFWriter> *w)

{
  element_type *this_00;
  size_t in_RCX;
  void *__buf;
  int __fd;
  QPDFExc *e;
  runtime_error *e_1;
  shared_ptr<QPDFWriter> *w_local;
  FuzzHelper *this_local;
  
  __fd = (int)w;
  this_00 = std::__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       w);
  QPDFWriter::write(this_00,__fd,__buf,in_RCX);
  return;
}

Assistant:

void
FuzzHelper::doWrite(std::shared_ptr<QPDFWriter> w)
{
    try {
        w->write();
    } catch (QPDFExc const& e) {
        std::cerr << e.what() << std::endl;
    } catch (std::runtime_error const& e) {
        std::cerr << e.what() << std::endl;
    }
}